

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,TypeVector *expected)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  byte bVar4;
  Result RVar5;
  Result RVar6;
  Result RVar7;
  Enum EVar8;
  ulong uVar9;
  ulong uVar10;
  Type TVar11;
  bool bVar12;
  bool bVar13;
  Type type2;
  Type type1;
  Type local_40;
  Type local_38;
  
  uVar9 = 0xffffffff00000000;
  local_38.enum_ = Any;
  local_38.type_index_ = 0xffffffff;
  local_40.enum_ = Any;
  local_40.type_index_ = 0xffffffff;
  RVar5 = PeekAndCheckType(this,0,(Type)0xffffffffffffffff);
  RVar6 = PeekType(this,1,&local_38);
  RVar7 = PeekType(this,2,&local_40);
  bVar3 = RVar7.enum_ == Error || (RVar6.enum_ == Error || RVar5.enum_ == Error);
  pTVar1 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar2) {
    uVar9 = 0xffffffff00000000;
    bVar4 = 1;
    if ((((uint)(local_38.enum_ + 0x15) < 6) &&
        ((0x31U >> (local_38.enum_ + 0x15 & 0x1fU) & 1) != 0)) ||
       (((uint)(local_40.enum_ + 0x15) < 6 && ((0x31U >> (local_40.enum_ + 0x15 & 0x1fU) & 1) != 0))
       )) {
      uVar10 = 0;
    }
    else {
      if (local_38.enum_ == Any || local_40.enum_ == Any) {
        bVar12 = false;
      }
      else {
        if (local_38.enum_ == Reference && local_40.enum_ == Reference) {
          bVar12 = ((ulong)local_40 ^ (ulong)local_38) >> 0x20 == 0;
        }
        else {
          bVar12 = local_38.enum_ == local_40.enum_;
        }
        bVar12 = !bVar12;
      }
      bVar4 = bVar3 | bVar12;
      uVar9 = (ulong)local_38 & 0xffffffff00000000;
      uVar10 = (ulong)local_38 & 0xffffffff;
    }
  }
  else {
    if ((long)pTVar2 - (long)pTVar1 != 8) {
      __assert_fail("expected.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/type-checker.cc"
                    ,0x356,"Result wabt::TypeChecker::OnSelect(const TypeVector &)");
    }
    TVar11 = *pTVar1;
    EVar8 = TVar11.enum_;
    if (local_38.enum_ == Any || EVar8 == Any) {
      bVar12 = false;
    }
    else {
      if (local_38.enum_ == Reference && EVar8 == Reference) {
        bVar12 = ((ulong)local_38 ^ (ulong)TVar11) >> 0x20 == 0;
      }
      else {
        bVar12 = local_38.enum_ == EVar8;
      }
      bVar12 = !bVar12;
    }
    if (local_40.enum_ == Any || EVar8 == Any) {
      bVar13 = false;
    }
    else {
      if (local_40.enum_ == Reference && EVar8 == Reference) {
        bVar13 = ((ulong)local_40 ^ (ulong)TVar11) >> 0x20 == 0;
      }
      else {
        bVar13 = local_40.enum_ == EVar8;
      }
      bVar13 = !bVar13;
    }
    bVar4 = bVar3 | bVar12 | bVar13;
    uVar10 = 0;
  }
  TVar11 = (Type)(uVar10 | uVar9);
  RVar5.enum_._1_3_ = 0;
  RVar5.enum_._0_1_ = bVar4;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>(this,RVar5,"select",TVar11,TVar11,I32);
  RVar5 = DropTypes(this,3);
  PushType(this,TVar11);
  return (Result)(uint)(bVar4 | RVar5.enum_ == Error);
}

Assistant:

Result TypeChecker::OnSelect(const TypeVector& expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected.empty()) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    assert(expected.size() == 1);
    result |= CheckType(type1, expected[0]);
    result |= CheckType(type2, expected[0]);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}